

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextengine.cpp
# Opt level: O2

QFixed __thiscall QTextEngine::width(QTextEngine *this,int from,int len)

{
  ushort uVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  QFixed QVar6;
  unsigned_short *puVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  QScriptItem *pQVar13;
  int i;
  int iVar14;
  ulong uVar15;
  int j;
  long in_FS_OFFSET;
  QFixed local_74;
  undefined1 local_68 [48];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  itemize(this);
  local_74.val = 0;
  for (uVar15 = 0; uVar15 < (ulong)(this->layoutData->items).d.size; uVar15 = uVar15 + 1) {
    pQVar13 = (this->layoutData->items).d.ptr;
    uVar2 = pQVar13[uVar15].position;
    iVar14 = (int)uVar15;
    iVar4 = length(this,iVar14);
    if (len + from <= (int)uVar2) break;
    if (from < (int)(iVar4 + uVar2)) {
      pQVar13 = pQVar13 + uVar15;
      if (pQVar13->num_glyphs == 0) {
        shape(this,iVar14);
      }
      uVar5 = (uint)pQVar13->analysis >> 8 & 0xf;
      if (uVar5 == 7) {
        QVar6 = calculateTabWidth(this,iVar14,local_74);
        local_74.val = local_74.val + QVar6.val;
      }
      else if (uVar5 == 8) {
        local_74.val = local_74.val + (pQVar13->width).val;
      }
      else {
        iVar14 = pQVar13->position;
        puVar7 = this->layoutData->logClustersPtr;
        uVar9 = from - uVar2;
        uVar5 = uVar9;
        if ((int)uVar9 < 1) {
          uVar5 = 0;
        }
        uVar11 = (ulong)uVar5;
        if (((int)uVar9 < 1) ||
           (lVar3 = (long)iVar14 + uVar11, puVar7[(long)iVar14 + (uVar11 - 1)] != puVar7[lVar3])) {
LAB_004856c6:
          if ((int)uVar11 < iVar4) {
            uVar11 = (ulong)puVar7[(long)iVar14 + (long)(int)uVar11];
            iVar8 = ~uVar2 + len + from;
            iVar10 = iVar4 + -1;
            if (iVar8 < iVar4) {
              iVar10 = iVar8;
            }
            lVar12 = (long)iVar10;
            lVar3 = iVar14 + lVar12;
            iVar8 = iVar4;
            if (iVar4 < iVar10) {
              iVar8 = iVar10;
            }
            for (; lVar12 < iVar4; lVar12 = lVar12 + 1) {
              if (puVar7[iVar14 + lVar12] != puVar7[lVar3]) {
                iVar8 = (int)lVar12;
                break;
              }
            }
            puVar7 = puVar7 + (long)iVar14 + (long)iVar8;
            if (iVar8 == iVar4) {
              puVar7 = &pQVar13->num_glyphs;
            }
            uVar1 = *puVar7;
            local_68._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_68._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_68._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_68._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            shapedGlyphs((QGlyphLayout *)local_68,this,pQVar13);
            for (; uVar11 < uVar1; uVar11 = uVar11 + 1) {
              iVar4 = 0;
              if (((byte)*(QGlyphAttributes *)(local_68._32_8_ + uVar11) & 2) == 0) {
                iVar4 = ((QFixed *)(local_68._16_8_ + uVar11 * 4))->val;
              }
              local_74.val = local_74.val + iVar4;
            }
          }
        }
        else {
          for (; (long)uVar11 < (long)iVar4; uVar11 = uVar11 + 1) {
            if (puVar7[(long)iVar14 + uVar11] != puVar7[lVar3]) goto LAB_004856c6;
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QFixed)local_74.val;
}

Assistant:

QFixed QTextEngine::width(int from, int len) const
{
    itemize();

    QFixed w = 0;
//     qDebug("QTextEngine::width(from = %d, len = %d), numItems=%d, strleng=%d", from,  len, items.size(), string.length());
    textIterator(this, from, len, w, [this, &w](int glyphStart, int glyphEnd, const QScriptItem *si) {
        QGlyphLayout glyphs = this->shapedGlyphs(si);
        for (int j = glyphStart; j < glyphEnd; j++)
            w += glyphs.advances[j] * !glyphs.attributes[j].dontPrint;
    });
//     qDebug("   --> w= %d ", w);
    return w;
}